

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O3

string * __thiscall
libcellml::Generator::GeneratorImpl::newLineIfNeeded_abi_cxx11_
          (string *__return_storage_ptr__,GeneratorImpl *this)

{
  char *pcVar1;
  bool bVar2;
  
  bVar2 = (this->mCode)._M_string_length != 0;
  pcVar1 = "";
  if (bVar2) {
    pcVar1 = "\n";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + bVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::GeneratorImpl::newLineIfNeeded()
{
    return mCode.empty() ? "" : "\n";
}